

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

TCGArg do_constant_folding_cond(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y,TCGCond c)

{
  uint64_t x_00;
  uint64_t y_00;
  _Bool _Var1;
  tcg_temp_info *ptVar2;
  TCGOpDef *def;
  tcg_target_ulong yv;
  tcg_target_ulong xv;
  TCGCond c_local;
  TCGArg y_local;
  TCGArg x_local;
  TCGOpcode op_local;
  TCGContext_conflict9 *s_local;
  
  ptVar2 = arg_info(x);
  x_00 = ptVar2->val;
  ptVar2 = arg_info(y);
  y_00 = ptVar2->val;
  _Var1 = arg_is_const(x);
  if ((_Var1) && (_Var1 = arg_is_const(y), _Var1)) {
    if ((s->tcg_op_defs[op].flags & 0x10) == 0) {
      _Var1 = do_constant_folding_cond_32((uint32_t)x_00,(uint32_t)y_00,c);
      s_local = (TCGContext_conflict9 *)(ulong)_Var1;
    }
    else {
      _Var1 = do_constant_folding_cond_64(x_00,y_00,c);
      s_local = (TCGContext_conflict9 *)(ulong)_Var1;
    }
  }
  else {
    _Var1 = args_are_copies(x,y);
    if (_Var1) {
      _Var1 = do_constant_folding_cond_eq(c);
      s_local = (TCGContext_conflict9 *)(ulong)_Var1;
    }
    else {
      _Var1 = arg_is_const(y);
      if ((_Var1) && (y_00 == 0)) {
        if (c == TCG_COND_LTU) {
          s_local = (TCGContext_conflict9 *)0x0;
        }
        else if (c == TCG_COND_GEU) {
          s_local = (TCGContext_conflict9 *)&DAT_00000001;
        }
        else {
          s_local = (TCGContext_conflict9 *)&DAT_00000002;
        }
      }
      else {
        s_local = (TCGContext_conflict9 *)&DAT_00000002;
      }
    }
  }
  return (TCGArg)s_local;
}

Assistant:

static TCGArg do_constant_folding_cond(TCGContext *s, TCGOpcode op, TCGArg x,
                                       TCGArg y, TCGCond c)
{
    tcg_target_ulong xv = arg_info(x)->val;
    tcg_target_ulong yv = arg_info(y)->val;
    if (arg_is_const(x) && arg_is_const(y)) {
        const TCGOpDef *def = &s->tcg_op_defs[op];
        tcg_debug_assert(!(def->flags & TCG_OPF_VECTOR));
        if (def->flags & TCG_OPF_64BIT) {
            return do_constant_folding_cond_64(xv, yv, c);
        } else {
            return do_constant_folding_cond_32(xv, yv, c);
        }
    } else if (args_are_copies(x, y)) {
        return do_constant_folding_cond_eq(c);
    } else if (arg_is_const(y) && yv == 0) {
        switch (c) {
        case TCG_COND_LTU:
            return 0;
        case TCG_COND_GEU:
            return 1;
        default:
            return 2;
        }
    }
    return 2;
}